

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_crease(REF_GRID ref_grid,REF_INT node,REF_DBL *dot_prod)

{
  REF_INT RVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  uint uVar4;
  REF_INT local_190;
  REF_INT local_18c;
  REF_DBL local_188;
  REF_INT local_180;
  int local_17c;
  REF_INT local_178;
  int local_174;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL area_sign1;
  REF_DBL n1 [3];
  REF_DBL area_sign0;
  REF_DBL n0 [3];
  REF_DBL local_108;
  REF_DBL s [3];
  REF_DBL local_e8;
  REF_DBL r [3];
  REF_DBL local_c8;
  REF_DBL uv [2];
  REF_INT nodes [27];
  REF_INT id;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT item1;
  REF_INT item0;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *dot_prod_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  pRVar2 = ref_grid->node;
  pRVar3 = ref_grid->cell[3];
  *dot_prod = 1.0;
  if (((-1 < node) && (node < pRVar2->max)) && (-1 < pRVar2->global[node])) {
    if ((node < 0) || (pRVar3->ref_adj->nnode <= node)) {
      local_174 = -1;
    }
    else {
      local_174 = pRVar3->ref_adj->first[node];
    }
    cell0 = local_174;
    if (local_174 == -1) {
      local_178 = -1;
    }
    else {
      local_178 = pRVar3->ref_adj->item[local_174].ref;
    }
    id = local_178;
    while (cell0 != -1) {
      uVar4 = ref_cell_nodes(ref_grid->cell[3],id,(REF_INT *)(uv + 1));
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x701,"ref_geom_crease",(ulong)uVar4,"tri list for edge");
        return uVar4;
      }
      uVar4 = ref_geom_tri_centroid(ref_grid,(REF_INT *)(uv + 1),&local_c8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x702,"ref_geom_crease",(ulong)uVar4,"tri cent");
        return uVar4;
      }
      RVar1 = nodes[(long)pRVar3->node_per + -2];
      uVar4 = ref_geom_face_rsn(ref_grid->geom,RVar1,&local_c8,&local_e8,&local_108,&area_sign0);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x704,"ref_geom_crease",(ulong)uVar4,"rsn");
        return uVar4;
      }
      uVar4 = ref_geom_uv_area_sign(ref_grid,RVar1,n1 + 2);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x705,"ref_geom_crease",(ulong)uVar4,"a sign");
        return uVar4;
      }
      if ((node < 0) || (pRVar3->ref_adj->nnode <= node)) {
        local_17c = -1;
      }
      else {
        local_17c = pRVar3->ref_adj->first[node];
      }
      cell1 = local_17c;
      if (local_17c == -1) {
        local_180 = -1;
      }
      else {
        local_180 = pRVar3->ref_adj->item[local_17c].ref;
      }
      nodes[0x1a] = local_180;
      while (cell1 != -1) {
        uVar4 = ref_cell_nodes(ref_grid->cell[3],nodes[0x1a],(REF_INT *)(uv + 1));
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x708,"ref_geom_crease",(ulong)uVar4,"tri list for edge");
          return uVar4;
        }
        uVar4 = ref_geom_tri_centroid(ref_grid,(REF_INT *)(uv + 1),&local_c8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x709,"ref_geom_crease",(ulong)uVar4,"tri cent");
          return uVar4;
        }
        RVar1 = nodes[(long)pRVar3->node_per + -2];
        uVar4 = ref_geom_face_rsn(ref_grid->geom,RVar1,&local_c8,&local_e8,&local_108,&area_sign1);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x70b,"ref_geom_crease",(ulong)uVar4,"rsn");
          return uVar4;
        }
        uVar4 = ref_geom_uv_area_sign(ref_grid,RVar1,(REF_DBL *)&ref_private_macro_code_rss_1);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x70c,"ref_geom_crease",(ulong)uVar4,"a sign");
          return uVar4;
        }
        if (n1[2] * _ref_private_macro_code_rss_1 *
            (n0[1] * n1[1] + area_sign0 * area_sign1 + n0[0] * n1[0]) <= *dot_prod) {
          local_188 = n1[2] * _ref_private_macro_code_rss_1 *
                      (n0[1] * n1[1] + area_sign0 * area_sign1 + n0[0] * n1[0]);
        }
        else {
          local_188 = *dot_prod;
        }
        *dot_prod = local_188;
        cell1 = pRVar3->ref_adj->item[cell1].next;
        if (cell1 == -1) {
          local_18c = -1;
        }
        else {
          local_18c = pRVar3->ref_adj->item[cell1].ref;
        }
        nodes[0x1a] = local_18c;
      }
      cell0 = pRVar3->ref_adj->item[cell0].next;
      if (cell0 == -1) {
        local_190 = -1;
      }
      else {
        local_190 = pRVar3->ref_adj->item[cell0].ref;
      }
      id = local_190;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_crease(REF_GRID ref_grid, REF_INT node,
                                   REF_DBL *dot_prod) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item0, item1, cell0, cell1, id;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL uv[2];
  REF_DBL r[3], s[3];
  REF_DBL n0[3], area_sign0;
  REF_DBL n1[3], area_sign1;

  *dot_prod = 1.0;

  if (!ref_node_valid(ref_node, node)) {
    return REF_SUCCESS;
  }

  each_ref_cell_having_node(ref_cell, node, item0, cell0) {
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell0, nodes),
        "tri list for edge");
    RSS(ref_geom_tri_centroid(ref_grid, nodes, uv), "tri cent");
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_face_rsn(ref_grid_geom(ref_grid), id, uv, r, s, n0), "rsn");
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign0), "a sign");
    each_ref_cell_having_node(ref_cell, node, item1, cell1) {
      RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell1, nodes),
          "tri list for edge");
      RSS(ref_geom_tri_centroid(ref_grid, nodes, uv), "tri cent");
      id = nodes[ref_cell_node_per(ref_cell)];
      RSS(ref_geom_face_rsn(ref_grid_geom(ref_grid), id, uv, r, s, n1), "rsn");
      RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign1), "a sign");

      *dot_prod =
          MIN(*dot_prod, area_sign0 * area_sign1 * ref_math_dot(n0, n1));
    }
  }

  return REF_SUCCESS;
}